

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm.cpp
# Opt level: O3

void EBPLM::PredictVelOnYFace
               (Box *yebox,Array4<double> *Imy,Array4<double> *Ipy,Array4<const_double> *q,
               Array4<const_double> *ccvel,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  BCRec *bcrec;
  long lVar29;
  double *pdVar30;
  long lVar31;
  double *pdVar32;
  double *pdVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  double *pdVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double *pdVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  EBCellFlag *pEVar47;
  long lVar48;
  long lVar49;
  double *pdVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  double *pdVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  double *pdVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  double *pdVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  undefined8 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  int iVar80;
  pair<bool,_bool> pVar81;
  pair<bool,_bool> pVar82;
  pair<bool,_bool> pVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  uint uVar89;
  int iVar90;
  ulong uVar91;
  long lVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  ulong uVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  long lVar114;
  long lVar115;
  long lVar116;
  long lVar117;
  long lVar118;
  long lVar119;
  long lVar120;
  Long *pLVar121;
  int iVar122;
  int iVar123;
  uint uVar124;
  long lVar125;
  long lVar126;
  long lVar127;
  long lVar128;
  long lVar129;
  long lVar130;
  long lVar131;
  int dir;
  int dir_00;
  int iVar132;
  long lVar133;
  double **ppdVar134;
  int iVar135;
  int iVar136;
  double *pdVar137;
  double *pdVar138;
  double *pdVar139;
  char cVar140;
  long lVar141;
  double *pdVar142;
  double *pdVar143;
  long lVar144;
  long lVar145;
  long lVar146;
  double *pdVar147;
  int iVar148;
  long lVar149;
  long lVar150;
  long lVar151;
  long lVar152;
  long lVar153;
  long lVar154;
  long lVar155;
  long lVar156;
  double *pdVar157;
  char cVar158;
  int kk_1;
  uint uVar159;
  long lVar160;
  long lVar161;
  long lVar162;
  long lVar163;
  double *pdVar164;
  double *pdVar165;
  int jj;
  long lVar166;
  long lVar167;
  long lVar168;
  int iVar169;
  int iVar170;
  long lVar171;
  bool bVar172;
  int iVar173;
  int iVar174;
  long lVar175;
  long lVar176;
  long lVar177;
  long lVar178;
  long lVar179;
  long lVar180;
  long lVar181;
  int iVar182;
  long lVar183;
  int iVar184;
  int iVar185;
  bool bVar186;
  ulong uVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  ulong uVar193;
  double dVar194;
  double dVar195;
  double dVar197;
  undefined1 auVar196 [16];
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  ulong uVar205;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  undefined1 auVar212 [16];
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  undefined4 uVar218;
  undefined4 uVar219;
  undefined4 uVar220;
  undefined4 uVar221;
  double dVar222;
  double dVar223;
  int cuts_z;
  Real delta_z;
  Real delta_x;
  Real du [27];
  Real A [27] [3];
  double *local_928;
  long local_898;
  double adStack_3b8 [28];
  anon_class_680_18_513cbdb0 local_2d8;
  
  dVar188 = dt / (geom->super_CoordSys).dx[1];
  iVar182 = (geom->domain).smallend.vect[0];
  iVar185 = (geom->domain).smallend.vect[1];
  bcrec = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  iVar170 = (geom->domain).bigend.vect[0];
  iVar3 = (geom->domain).bigend.vect[1];
  pVar81 = anon_unknown.dwarf_63c290::has_extdir_or_ho(bcrec,0,(int)Ipy);
  pVar82 = anon_unknown.dwarf_63c290::has_extdir_or_ho(bcrec,1,dir);
  iVar4 = (geom->domain).smallend.vect[2];
  iVar5 = (geom->domain).bigend.vect[2];
  pVar83 = anon_unknown.dwarf_63c290::has_extdir_or_ho(bcrec,2,dir_00);
  if ((((ushort)pVar81 & 1) == 0) || (iVar182 < (yebox->smallend).vect[0] + -1)) {
    iVar6 = (yebox->bigend).vect[0];
    if ((((iVar6 < iVar170 || ((ushort)pVar81 >> 8 & 1) == 0) &&
         ((((ushort)pVar83 & 1) == 0 || (iVar4 < (yebox->smallend).vect[2] + -1)))) &&
        ((((ushort)pVar83 >> 8 & 1) == 0 || ((yebox->bigend).vect[2] < iVar5)))) &&
       (((((ushort)pVar82 & 1) == 0 || (iVar185 < (yebox->smallend).vect[1] + -1)) &&
        ((((ushort)pVar82 >> 8 & 1) == 0 || ((yebox->bigend).vect[1] < iVar3)))))) {
      lVar29 = ccc->nstride;
      iVar182 = (ccc->begin).x;
      lVar125 = (long)iVar182;
      pdVar30 = ccc->p;
      lVar31 = ccvel->nstride;
      pdVar32 = ccvel->p;
      pdVar33 = q->p;
      lVar34 = q->jstride;
      lVar35 = q->kstride;
      lVar36 = q->nstride;
      iVar185 = (q->begin).x;
      lVar126 = (long)iVar185;
      iVar170 = (q->begin).y;
      lVar152 = (long)iVar170;
      iVar3 = (q->begin).z;
      lVar153 = (long)iVar3;
      lVar37 = ccvel->jstride;
      lVar38 = ccvel->kstride;
      lVar154 = (long)(ccvel->begin).x;
      lVar155 = (long)(ccvel->begin).y;
      iVar4 = (ccvel->begin).z;
      pdVar39 = Imy->p;
      lVar40 = Imy->jstride;
      lVar41 = Imy->kstride;
      lVar42 = Imy->nstride;
      iVar5 = (Imy->begin).x;
      iVar6 = (Imy->begin).y;
      iVar7 = (Imy->begin).z;
      pdVar43 = Ipy->p;
      lVar44 = Ipy->jstride;
      lVar45 = Ipy->kstride;
      lVar46 = Ipy->nstride;
      iVar8 = (Ipy->begin).x;
      uVar9 = (Ipy->begin).y;
      iVar10 = (Ipy->begin).z;
      pEVar47 = flag->p;
      lVar48 = flag->jstride;
      lVar49 = flag->kstride;
      iVar11 = (flag->begin).x;
      lVar160 = (long)(flag->begin).y;
      iVar12 = (flag->begin).z;
      pdVar50 = vfrac->p;
      lVar51 = vfrac->jstride;
      lVar52 = vfrac->kstride;
      uVar13 = (vfrac->begin).x;
      lVar166 = (long)(int)uVar13;
      iVar135 = (vfrac->begin).y;
      lVar161 = (long)iVar135;
      uVar14 = (vfrac->begin).z;
      lVar162 = (long)(int)uVar14;
      lVar53 = ccc->jstride;
      lVar54 = ccc->kstride;
      iVar15 = (ccc->begin).y;
      iVar16 = (ccc->begin).z;
      pdVar55 = fcx->p;
      lVar56 = fcx->jstride;
      lVar57 = fcx->kstride;
      lVar58 = fcx->nstride;
      iVar17 = (fcx->begin).x;
      lVar175 = (long)(fcx->begin).y;
      iVar18 = (fcx->begin).z;
      pdVar59 = fcy->p;
      lVar60 = fcy->jstride;
      lVar61 = fcy->kstride;
      lVar62 = fcy->nstride;
      lVar176 = (long)(fcy->begin).x;
      iVar19 = (fcy->begin).y;
      iVar20 = (fcy->begin).z;
      pdVar63 = fcz->p;
      lVar64 = fcz->jstride;
      lVar65 = fcz->kstride;
      lVar66 = fcz->nstride;
      lVar177 = (long)(fcz->begin).x;
      lVar178 = (long)(fcz->begin).y;
      iVar21 = (fcz->begin).z;
      iVar22 = (yebox->smallend).vect[0];
      lVar179 = (long)iVar22;
      iVar23 = (yebox->smallend).vect[1];
      iVar24 = (yebox->smallend).vect[2];
      iVar25 = (yebox->bigend).vect[0];
      iVar26 = (yebox->bigend).vect[1];
      iVar27 = (yebox->bigend).vect[2];
      local_898 = 0;
      do {
        if (iVar24 <= iVar27) {
          lVar127 = local_898 * lVar36;
          lVar131 = (long)iVar24;
          do {
            if (iVar26 < iVar23) {
              uVar91 = lVar131 + 1U & 0xffffffff;
            }
            else {
              lVar92 = (lVar131 - iVar12) * lVar49;
              uVar91 = lVar131 + 1;
              lVar180 = (lVar131 - lVar162) * lVar52;
              lVar156 = (lVar131 - lVar153) * lVar35;
              lVar93 = (lVar131 - iVar4) * lVar38;
              lVar94 = (lVar131 - iVar20) * lVar61;
              lVar95 = (lVar131 - iVar16) * lVar54;
              iVar122 = (int)lVar131;
              iVar84 = iVar122 - iVar3;
              lVar96 = iVar84 * lVar35;
              lVar97 = ((lVar131 + -1) - lVar162) * lVar52;
              lVar98 = (uVar91 - lVar162) * lVar52;
              lVar171 = ((lVar131 + -1) - lVar153) * lVar35;
              lVar99 = (uVar91 - lVar153) * lVar35;
              lVar100 = (lVar131 - iVar18) * lVar57;
              lVar144 = ((int)uVar91 - iVar21) * lVar65;
              lVar145 = (lVar131 - iVar21) * lVar65;
              lVar101 = (int)(~uVar14 + iVar122) * lVar52;
              lVar102 = (int)((int)uVar91 - uVar14) * lVar52;
              lVar133 = (~(long)iVar16 + lVar131) * lVar54;
              lVar181 = (long)iVar23;
              do {
                if (iVar25 < iVar22) {
                  uVar103 = lVar181 + 1U & 0xffffffff;
                }
                else {
                  lVar104 = (lVar181 - lVar161) * lVar51;
                  lVar2 = lVar181 + -1;
                  lVar105 = (lVar2 - lVar161) * lVar51;
                  lVar118 = lVar181 + -2;
                  lVar106 = (lVar118 - lVar161) * lVar51;
                  uVar103 = lVar181 + 1;
                  lVar107 = (uVar103 - lVar161) * lVar51;
                  lVar141 = (lVar181 - lVar152) * lVar34;
                  lVar149 = (lVar181 - lVar155) * lVar37;
                  lVar150 = (lVar2 - lVar152) * lVar34;
                  lVar151 = (uVar103 - lVar152) * lVar34;
                  lVar167 = (lVar118 - lVar152) * lVar34;
                  lVar108 = (lVar181 - iVar19) * lVar60;
                  lVar109 = (lVar181 - iVar15) * lVar53;
                  iVar173 = (int)lVar181;
                  iVar85 = iVar173 - iVar170;
                  lVar110 = iVar85 * lVar34;
                  iVar136 = (int)uVar103;
                  lVar111 = (lVar181 - lVar175) * lVar56;
                  lVar112 = (lVar181 - lVar178) * lVar64;
                  lVar113 = (iVar136 - iVar135) * lVar51;
                  lVar114 = ((int)lVar118 - iVar135) * lVar51;
                  lVar146 = ((int)lVar118 - iVar170) * lVar34;
                  iVar86 = (int)lVar2 - iVar15;
                  iVar87 = (int)lVar2 - iVar170;
                  lVar115 = iVar87 * lVar34;
                  lVar116 = (lVar2 - lVar175) * lVar56;
                  lVar117 = (lVar2 - lVar178) * lVar64;
                  lVar163 = (lVar2 - lVar155) * lVar37;
                  lVar118 = (~(long)iVar15 + lVar181) * lVar53;
                  lVar128 = lVar179 + lVar133 + lVar118;
                  pdVar147 = pdVar30 + ((lVar118 + lVar133 + lVar29 + lVar179 + -1) - lVar125);
                  pdVar137 = pdVar30 + ((lVar29 * 2 + lVar128 + -1) - lVar125);
                  pdVar157 = pdVar30 + ((lVar128 + -1) - lVar125);
                  lVar118 = lVar179;
                  iVar184 = (iVar22 + -1) - iVar185;
                  iVar80 = (iVar22 + -1) - iVar182;
                  do {
                    lVar128 = lVar118 - iVar11;
                    uVar28 = pEVar47[lVar92 + (lVar181 - lVar160) * lVar48 + lVar128].flag;
                    dVar189 = 0.0;
                    dVar194 = 0.0;
                    if ((short)uVar28 < 0) {
                      lVar129 = lVar118 - lVar166;
                      dVar200 = pdVar50[lVar104 + lVar129 + lVar180];
                      iVar88 = (int)lVar118;
                      if ((dVar200 != 1.0) || (NAN(dVar200))) {
LAB_00408531:
                        lVar130 = lVar118 - lVar176;
                        dVar194 = pdVar59[lVar94 + lVar108 + lVar130];
                        dVar208 = (pdVar59 + lVar94 + lVar108 + lVar130)[lVar62];
                        lVar119 = lVar118 - lVar125;
                        dVar199 = pdVar30[lVar95 + lVar109 + lVar119 + lVar29];
                        dVar211 = pdVar30[lVar95 + lVar109 + lVar119];
                        dVar195 = pdVar30[lVar95 + lVar109 + lVar119 + lVar29 * 2];
                        lVar119 = (long)(iVar88 - iVar185);
                        dVar202 = pdVar33[lVar110 + lVar119 + lVar96 + lVar127];
                        dVar216 = pdVar33[lVar150 + lVar96 + lVar127 + lVar119];
                        lVar183 = -1;
                        cVar140 = '\x05';
                        lVar120 = 0;
                        pdVar138 = pdVar137;
                        pdVar142 = pdVar157;
                        pdVar164 = pdVar147;
                        do {
                          lVar168 = -1;
                          pdVar139 = pdVar138;
                          pdVar143 = pdVar142;
                          pdVar165 = pdVar164;
                          cVar158 = cVar140;
                          do {
                            iVar132 = (int)lVar120;
                            ppdVar134 = &local_2d8.q.p + (long)iVar132 * 3;
                            lVar120 = 0;
                            do {
                              iVar123 = (int)lVar120 + -1;
                              if ((((int)lVar168 == 0 && (int)lVar183 == 0) && iVar123 == 0) ||
                                 ((1 << (cVar158 + (char)lVar120 & 0x1fU) & uVar28) == 0)) {
                                *ppdVar134 = (double *)0x0;
                                ppdVar134[1] = (double *)0x0;
                                ppdVar134[2] = (double *)0x0;
                              }
                              else {
                                dVar189 = pdVar165[lVar120];
                                *ppdVar134 = (double *)
                                             ((pdVar143[lVar120] + (double)iVar123) - dVar211);
                                ppdVar134[1] = (double *)
                                               ((dVar189 + (double)(int)lVar168) - dVar199);
                                ppdVar134[2] = (double *)
                                               ((pdVar139[lVar120] + (double)(int)lVar183) - dVar195
                                               );
                              }
                              lVar120 = lVar120 + 1;
                              ppdVar134 = ppdVar134 + 3;
                            } while (lVar120 != 3);
                            lVar168 = lVar168 + 1;
                            pdVar139 = pdVar139 + lVar53;
                            pdVar165 = pdVar165 + lVar53;
                            pdVar143 = pdVar143 + lVar53;
                            cVar158 = cVar158 + '\x03';
                            lVar120 = (long)iVar132 + 3;
                          } while (lVar168 != 2);
                          lVar183 = lVar183 + 1;
                          pdVar138 = pdVar138 + lVar54;
                          pdVar164 = pdVar164 + lVar54;
                          pdVar142 = pdVar142 + lVar54;
                          cVar140 = cVar140 + '\t';
                          lVar120 = (long)iVar132 + 3;
                        } while (lVar183 != 2);
                        lVar183 = -1;
                        cVar140 = '\x05';
                        lVar120 = 0;
                        do {
                          lVar168 = -1;
                          cVar158 = cVar140;
                          do {
                            iVar132 = (int)lVar120;
                            lVar120 = 0;
                            do {
                              dVar189 = 0.0;
                              if (((int)lVar120 != 1 || ((int)lVar168 != 0 || (int)lVar183 != 0)) &&
                                 ((1 << (cVar158 + (char)lVar120 & 0x1fU) & uVar28) != 0)) {
                                dVar189 = pdVar33[lVar127 + (iVar84 + (int)lVar183) * lVar35 +
                                                            (iVar85 + (int)lVar168) * lVar34 +
                                                            (long)(iVar184 + (int)lVar120)] -
                                          dVar202;
                              }
                              adStack_3b8[iVar132 + lVar120] = dVar189;
                              lVar120 = lVar120 + 1;
                            } while (lVar120 != 3);
                            lVar168 = lVar168 + 1;
                            cVar158 = cVar158 + '\x03';
                            lVar120 = (long)iVar132 + 3;
                          } while (lVar168 != 2);
                          lVar183 = lVar183 + 1;
                          cVar140 = cVar140 + '\t';
                          lVar120 = (long)iVar132 + 3;
                        } while (lVar183 != 2);
                        dVar208 = dVar208 - dVar195;
                        dVar201 = 0.0;
                        dVar203 = 0.0;
                        dVar213 = 0.0;
                        pLVar121 = &local_2d8.q.kstride;
                        lVar120 = 0;
                        dVar189 = 0.0;
                        dVar197 = 0.0;
                        dVar215 = 0.0;
                        dVar217 = 0.0;
                        dVar209 = 0.0;
                        dVar210 = 0.0;
                        do {
                          pdVar138 = ((Array4<const_double> *)(pLVar121 + -2))->p;
                          dVar204 = (double)pLVar121[-1];
                          dVar190 = (double)*pLVar121;
                          dVar198 = adStack_3b8[lVar120];
                          dVar209 = dVar209 + dVar204 * (double)pLVar121[-1];
                          dVar210 = dVar210 + (double)pdVar138 * (double)*pLVar121;
                          dVar213 = dVar213 + dVar190 * dVar190;
                          dVar215 = dVar215 + dVar198 * (double)pdVar138;
                          dVar217 = dVar217 + (double)pdVar138 * (double)pdVar138;
                          dVar201 = dVar201 + dVar198 * dVar204;
                          dVar203 = dVar203 + dVar204 * (double)pdVar138;
                          dVar189 = dVar189 + dVar190 * (double)pLVar121[-1];
                          dVar197 = dVar197 + dVar198 * (double)*pLVar121;
                          lVar120 = lVar120 + 1;
                          pLVar121 = pLVar121 + 3;
                        } while (lVar120 != 0x1b);
                        dVar198 = dVar203 * dVar213 - dVar210 * dVar189;
                        dVar204 = dVar203 * dVar197 - dVar210 * dVar201;
                        dVar190 = dVar203 * dVar189 + dVar210 * -dVar209;
                        dVar214 = dVar213 * dVar209 - dVar189 * dVar189;
                        dVar213 = dVar213 * dVar201 - dVar189 * dVar197;
                        auVar206._0_8_ =
                             dVar210 * (dVar201 * dVar189 - dVar197 * dVar209) +
                             (dVar215 * dVar214 - dVar213 * dVar203);
                        auVar206._8_8_ = dVar210 * dVar204 + (dVar217 * dVar213 - dVar198 * dVar215)
                        ;
                        dVar210 = dVar190 * dVar210 + (dVar214 * dVar217 - dVar198 * dVar203);
                        auVar207._8_8_ = dVar210;
                        auVar207._0_8_ = dVar210;
                        auVar207 = divpd(auVar206,auVar207);
                        dVar210 = (dVar190 * dVar215 +
                                  ((dVar197 * dVar209 + -dVar201 * dVar189) * dVar217 -
                                  dVar204 * dVar203)) / dVar210;
                        dVar197 = auVar207._0_8_;
                        dVar201 = auVar207._8_8_;
                        if ((dVar200 == 1.0) && (!NAN(dVar200))) {
                          if ((pdVar50[lVar104 + lVar180 + ((lVar118 + -1) - lVar166)] == 1.0) &&
                             (!NAN(pdVar50[lVar104 + lVar180 + ((lVar118 + -1) - lVar166)]))) {
                            if ((pdVar50[lVar104 + lVar180 + ((lVar118 + 1) - lVar166)] == 1.0) &&
                               (!NAN(pdVar50[lVar104 + lVar180 + ((lVar118 + 1) - lVar166)]))) {
                              dVar209 = dVar202 - pdVar33[lVar110 + lVar96 + lVar127 + ((lVar118 +
                                                                                        -1) - 
                                                  lVar126)];
                              dVar213 = pdVar33[lVar110 + lVar96 + lVar127 + ((lVar118 + 1) -
                                                                             lVar126)] - dVar202;
                              dVar209 = dVar209 + dVar209;
                              dVar213 = dVar213 + dVar213;
                              dVar189 = (pdVar33[lVar110 + lVar96 + lVar127 + ((lVar118 + 1) -
                                                                              lVar126)] -
                                        pdVar33[lVar110 + lVar96 + lVar127 + ((lVar118 + -1) -
                                                                             lVar126)]) * 0.5;
                              dVar203 = ABS(dVar209);
                              uVar187 = -(ulong)(0.0 < dVar189);
                              dVar189 = ABS(dVar189);
                              dVar197 = ABS(dVar213);
                              if (dVar203 <= dVar189) {
                                dVar189 = dVar203;
                              }
                              if (dVar189 <= dVar197) {
                                dVar197 = dVar189;
                              }
                              uVar193 = -(ulong)(0.0 < dVar209 * dVar213) & (ulong)dVar197;
                              dVar197 = (double)(~uVar187 & (uVar193 ^ 0x8000000000000000) |
                                                uVar187 & uVar193);
                            }
                          }
                          if ((((pdVar50[lVar105 + lVar180 + lVar129] == 1.0) &&
                               (!NAN(pdVar50[lVar105 + lVar180 + lVar129]))) &&
                              (pdVar50[lVar180 + lVar107 + lVar129] == 1.0)) &&
                             (!NAN(pdVar50[lVar180 + lVar107 + lVar129]))) {
                            dVar209 = pdVar33[lVar151 + lVar96 + lVar127 + lVar119] - dVar202;
                            dVar203 = (dVar202 - dVar216) + (dVar202 - dVar216);
                            dVar209 = dVar209 + dVar209;
                            dVar201 = (pdVar33[lVar151 + lVar96 + lVar127 + lVar119] - dVar216) *
                                      0.5;
                            dVar213 = ABS(dVar203);
                            uVar187 = -(ulong)(0.0 < dVar201);
                            dVar201 = ABS(dVar201);
                            dVar189 = ABS(dVar209);
                            if (dVar213 <= dVar201) {
                              dVar201 = dVar213;
                            }
                            if (dVar201 <= dVar189) {
                              dVar189 = dVar201;
                            }
                            uVar193 = -(ulong)(0.0 < dVar203 * dVar209) & (ulong)dVar189;
                            dVar201 = (double)(~uVar187 & (uVar193 ^ 0x8000000000000000) |
                                              uVar187 & uVar193);
                          }
                          if (((pdVar50[lVar104 + lVar129 + lVar97] == 1.0) &&
                              (!NAN(pdVar50[lVar104 + lVar129 + lVar97]))) &&
                             ((pdVar50[lVar104 + lVar129 + lVar98] == 1.0 &&
                              (!NAN(pdVar50[lVar104 + lVar129 + lVar98]))))) {
                            dVar209 = dVar202 - pdVar33[lVar110 + lVar119 + lVar171 + lVar127];
                            dVar210 = pdVar33[lVar110 + lVar119 + lVar99 + lVar127] - dVar202;
                            dVar209 = dVar209 + dVar209;
                            dVar210 = dVar210 + dVar210;
                            dVar203 = (pdVar33[lVar110 + lVar119 + lVar99 + lVar127] -
                                      pdVar33[lVar110 + lVar119 + lVar171 + lVar127]) * 0.5;
                            dVar213 = ABS(dVar209);
                            uVar187 = -(ulong)(0.0 < dVar203);
                            dVar203 = ABS(dVar203);
                            dVar189 = ABS(dVar210);
                            if (dVar213 <= dVar203) {
                              dVar203 = dVar213;
                            }
                            if (dVar203 <= dVar189) {
                              dVar189 = dVar203;
                            }
                            uVar193 = -(ulong)(0.0 < dVar209 * dVar210) & (ulong)dVar189;
                            dVar210 = (double)(~uVar187 & (uVar193 ^ 0x8000000000000000) |
                                              uVar187 & uVar193);
                          }
                        }
                        dVar189 = dVar216;
                        if (dVar202 <= dVar216) {
                          dVar189 = dVar202;
                        }
                        if (dVar216 <= dVar202) {
                          dVar216 = dVar202;
                        }
                        dVar194 = dVar194 - dVar211;
                        iVar90 = 0;
                        iVar148 = 0;
                        iVar132 = 0;
                        iVar123 = 0;
                        uVar159 = 0xffffffff;
                        do {
                          uVar124 = uVar159 + 1;
                          uVar89 = 0xffffffff;
                          iVar174 = iVar90;
                          do {
                            uVar1 = uVar89 + 1;
                            iVar169 = 5;
                            do {
                              if (((uVar28 >> (iVar169 + iVar174 & 0x1fU) & 1) != 0) &&
                                 ((iVar169 != 6 || uVar89 != 0) || uVar159 != 0)) {
                                iVar148 = iVar148 + (uint)((iVar169 - 5U & 0xfffffffd) == 0 &&
                                                          (uVar89 == 0 && uVar159 == 0));
                                iVar132 = iVar132 + (uint)((iVar169 == 6 && uVar159 == 0) &&
                                                          (uVar1 & 0xfffffffd) == 0);
                                iVar123 = iVar123 + (uint)((iVar169 == 6 && uVar89 == 0) &&
                                                          (uVar124 & 0xfffffffd) == 0);
                              }
                              iVar169 = iVar169 + 1;
                            } while (iVar169 != 8);
                            iVar174 = iVar174 + 3;
                            uVar89 = uVar1;
                          } while (uVar1 != 2);
                          iVar90 = iVar90 + 9;
                          uVar159 = uVar124;
                        } while (uVar124 != 2);
                        dVar203 = 2.0;
                        uVar219 = SUB84(dVar202,0);
                        uVar221 = (undefined4)((ulong)dVar202 >> 0x20);
                        if ((uVar28 >> 0x15 & 1) != 0) {
                          lVar119 = -1;
                          cVar140 = '\b';
                          uVar218 = uVar219;
                          uVar220 = uVar221;
                          dVar203 = dVar202;
                          do {
                            iVar90 = 0;
                            bVar186 = true;
                            do {
                              bVar172 = bVar186;
                              lVar120 = 0;
                              do {
                                if (((int)lVar120 != 1 || (iVar90 != 0 || (int)lVar119 != 0)) &&
                                   ((1 << ((char)iVar90 * '\x03' + cVar140 + (char)lVar120 & 0x1fU)
                                    & uVar28) != 0)) {
                                  dVar209 = pdVar33[lVar127 + (iVar84 + (int)lVar119) * lVar35 +
                                                              (iVar85 + iVar90) * lVar34 +
                                                              (long)(iVar184 + (int)lVar120)];
                                  dVar213 = dVar209;
                                  if (dVar209 <= dVar203) {
                                    dVar213 = dVar203;
                                  }
                                  dVar203 = dVar213;
                                  if (dVar209 <= (double)CONCAT44(uVar220,uVar218) &&
                                      (double)CONCAT44(uVar220,uVar218) != dVar209) {
                                    uVar218 = SUB84(dVar209,0);
                                    uVar220 = (undefined4)((ulong)dVar209 >> 0x20);
                                  }
                                }
                                lVar120 = lVar120 + 1;
                              } while (lVar120 != 3);
                              iVar90 = 1;
                              bVar186 = false;
                            } while (bVar172);
                            lVar119 = lVar119 + 1;
                            cVar140 = cVar140 + '\t';
                          } while (lVar119 != 2);
                          dVar209 = (((pdVar59 + lVar94 + (iVar136 - iVar19) * lVar60 + lVar130)
                                      [lVar62] - dVar195) * dVar210 +
                                    (0.5 - dVar199) * dVar201 +
                                    (pdVar59[lVar94 + (iVar136 - iVar19) * lVar60 + lVar130] -
                                    dVar211) * dVar197 + dVar202) - dVar202;
                          if (dVar209 <= 1e-13) {
                            dVar203 = 1.0;
                            if ((dVar209 < -1e-13) &&
                               (dVar203 = ((double)CONCAT44(uVar220,uVar218) - dVar202) / dVar209,
                               1.0 <= dVar203)) {
                              dVar203 = 1.0;
                            }
                          }
                          else {
                            dVar203 = (dVar203 - dVar202) / dVar209;
                            if (1.0 <= dVar203) {
                              dVar203 = 1.0;
                            }
                          }
                          if (2.0 <= dVar203) {
                            dVar203 = 2.0;
                          }
                        }
                        lVar119 = -1;
                        cVar140 = '\x05';
                        dVar209 = dVar202;
                        dVar213 = dVar202;
                        do {
                          lVar130 = -1;
                          cVar158 = cVar140;
                          do {
                            lVar120 = 0;
                            do {
                              if (((int)lVar120 != 1 || ((int)lVar130 != 0 || (int)lVar119 != 0)) &&
                                 ((1 << (cVar158 + (char)lVar120 & 0x1fU) & uVar28) != 0)) {
                                dVar215 = pdVar33[lVar127 + (iVar84 + (int)lVar119) * lVar35 +
                                                            (iVar85 + (int)lVar130) * lVar34 +
                                                            (long)(iVar184 + (int)lVar120)];
                                dVar217 = dVar215;
                                if (dVar215 <= dVar213) {
                                  dVar217 = dVar213;
                                }
                                dVar213 = dVar217;
                                if (dVar215 < dVar209) {
                                  dVar209 = dVar215;
                                }
                              }
                              lVar120 = lVar120 + 1;
                            } while (lVar120 != 3);
                            cVar158 = cVar158 + '\x03';
                            bVar186 = lVar130 != 0;
                            lVar130 = lVar130 + 1;
                          } while (bVar186);
                          lVar119 = lVar119 + 1;
                          cVar140 = cVar140 + '\t';
                        } while (lVar119 != 2);
                        dVar215 = (dVar208 * dVar210 +
                                  ((dVar194 * dVar197 + dVar202) - (dVar199 + 0.5) * dVar201)) -
                                  dVar202;
                        if (dVar215 <= 1e-13) {
                          dVar213 = 1.0;
                          if ((dVar215 < -1e-13) &&
                             (dVar213 = (dVar209 - dVar202) / dVar215, 1.0 <= dVar213)) {
                            dVar213 = 1.0;
                          }
                        }
                        else {
                          dVar213 = (dVar213 - dVar202) / dVar215;
                          if (1.0 <= dVar213) {
                            dVar213 = 1.0;
                          }
                        }
                        if (dVar203 <= dVar213) {
                          dVar213 = dVar203;
                        }
                        dVar203 = dVar213;
                        if ((uVar28 >> 0x13 & 1) != 0) {
                          lVar119 = -1;
                          dVar203 = dVar202;
                          dVar209 = dVar202;
                          do {
                            lVar130 = -1;
                            do {
                              iVar90 = 0;
                              bVar186 = true;
                              do {
                                bVar172 = bVar186;
                                if ((((int)lVar130 != 0 || (int)lVar119 != 0) || iVar90 != 0) &&
                                   ((1 << ((char)iVar90 +
                                           (char)lVar130 * '\x03' + (char)lVar119 * '\t' + '\x12' &
                                          0x1fU) & uVar28) != 0)) {
                                  dVar215 = pdVar33[lVar127 + (iVar84 + (int)lVar119) * lVar35 +
                                                              (iVar85 + (int)lVar130) * lVar34 +
                                                              (long)(iVar90 + (iVar88 - iVar185))];
                                  dVar217 = dVar215;
                                  if (dVar215 <= dVar203) {
                                    dVar217 = dVar203;
                                  }
                                  dVar203 = dVar217;
                                  if (dVar215 < dVar209) {
                                    dVar209 = dVar215;
                                  }
                                }
                                iVar90 = 1;
                                bVar186 = false;
                              } while (bVar172);
                              lVar130 = lVar130 + 1;
                            } while (lVar130 != 2);
                            lVar119 = lVar119 + 1;
                          } while (lVar119 != 2);
                          dVar215 = (((pdVar55 + lVar100 + lVar111 + ((iVar88 - iVar17) + 1))
                                      [lVar58] - dVar195) * dVar210 +
                                    (pdVar55[lVar100 + lVar111 + ((iVar88 - iVar17) + 1)] - dVar199)
                                    * dVar201 + (0.5 - dVar211) * dVar197 + dVar202) - dVar202;
                          if (dVar215 <= 1e-13) {
                            dVar203 = 1.0;
                            if ((dVar215 < -1e-13) &&
                               (dVar203 = (dVar209 - dVar202) / dVar215, 1.0 <= dVar203)) {
                              dVar203 = 1.0;
                            }
                          }
                          else {
                            dVar203 = (dVar203 - dVar202) / dVar215;
                            if (1.0 <= dVar203) {
                              dVar203 = 1.0;
                            }
                          }
                          if (dVar213 <= dVar203) {
                            dVar203 = dVar213;
                          }
                        }
                        dVar209 = dVar203;
                        if ((uVar28 >> 0x11 & 1) != 0) {
                          lVar119 = -1;
                          cVar140 = '\x05';
                          auVar212._8_8_ = 0;
                          auVar212._0_8_ = (ulong)dVar202;
                          dVar213 = dVar202;
                          do {
                            lVar130 = -1;
                            cVar158 = cVar140;
                            do {
                              lVar120 = 0;
                              do {
                                if (((int)lVar120 != 1 || ((int)lVar130 != 0 || (int)lVar119 != 0))
                                   && ((1 << (cVar158 + (char)lVar120 & 0x1fU) & uVar28) != 0)) {
                                  dVar209 = pdVar33[lVar127 + (iVar84 + (int)lVar119) * lVar35 +
                                                              (iVar85 + (int)lVar130) * lVar34 +
                                                              (long)(iVar184 + (int)lVar120)];
                                  uVar218 = SUB84(dVar209,0);
                                  uVar220 = (undefined4)((ulong)dVar209 >> 0x20);
                                  if (dVar209 <= auVar212._0_8_) {
                                    uVar218 = auVar212._0_4_;
                                    uVar220 = auVar212._4_4_;
                                  }
                                  if (dVar209 < dVar213) {
                                    dVar213 = dVar209;
                                  }
                                  auVar212._4_4_ = uVar220;
                                  auVar212._0_4_ = uVar218;
                                  auVar212._8_8_ = 0;
                                }
                                lVar120 = lVar120 + 1;
                              } while (lVar120 != 2);
                              lVar130 = lVar130 + 1;
                              cVar158 = cVar158 + '\x03';
                            } while (lVar130 != 2);
                            lVar119 = lVar119 + 1;
                            cVar140 = cVar140 + '\t';
                          } while (lVar119 != 2);
                          dVar215 = (((pdVar55 + lVar100 + lVar111 + (lVar118 - iVar17))[lVar58] -
                                     dVar195) * dVar210 +
                                    (pdVar55[lVar100 + lVar111 + (lVar118 - iVar17)] - dVar199) *
                                    dVar201 + (dVar202 - (dVar211 + 0.5) * dVar197)) - dVar202;
                          if (dVar215 <= 1e-13) {
                            dVar209 = 1.0;
                            if ((dVar215 < -1e-13) &&
                               (dVar209 = (dVar213 - dVar202) / dVar215, 1.0 <= dVar209)) {
                              dVar209 = 1.0;
                            }
                          }
                          else {
                            dVar209 = (auVar212._0_8_ - dVar202) / dVar215;
                            if (1.0 <= dVar209) {
                              dVar209 = 1.0;
                            }
                          }
                          if (dVar203 <= dVar209) {
                            dVar209 = dVar203;
                          }
                        }
                        dVar213 = 1.0;
                        dVar203 = dVar209;
                        if ((uVar28 >> 0x1b & 1) != 0) {
                          iVar90 = 0;
                          uVar218 = uVar219;
                          uVar220 = uVar221;
                          dVar203 = dVar202;
                          bVar186 = true;
                          do {
                            bVar172 = bVar186;
                            iVar174 = iVar90 * 9 + 0xe;
                            lVar119 = -1;
                            do {
                              lVar130 = 0;
                              do {
                                if (((int)lVar130 != 1 || ((int)lVar119 != 0 || iVar90 != 0)) &&
                                   ((1 << ((char)iVar174 + (char)lVar130 & 0x1fU) & uVar28) != 0)) {
                                  dVar215 = pdVar33[lVar127 + (iVar84 + iVar90) * lVar35 +
                                                              (iVar85 + (int)lVar119) * lVar34 +
                                                              (long)(iVar184 + (int)lVar130)];
                                  dVar217 = dVar215;
                                  if (dVar215 <= dVar203) {
                                    dVar217 = dVar203;
                                  }
                                  dVar203 = dVar217;
                                  if (dVar215 <= (double)CONCAT44(uVar220,uVar218) &&
                                      (double)CONCAT44(uVar220,uVar218) != dVar215) {
                                    uVar218 = SUB84(dVar215,0);
                                    uVar220 = (undefined4)((ulong)dVar215 >> 0x20);
                                  }
                                }
                                lVar130 = lVar130 + 1;
                              } while (lVar130 != 3);
                              lVar119 = lVar119 + 1;
                              iVar174 = iVar174 + 3;
                            } while (lVar119 != 2);
                            iVar90 = 1;
                            bVar186 = false;
                          } while (bVar172);
                          dVar215 = ((0.5 - dVar195) * dVar210 +
                                    ((pdVar63 + lVar112 + lVar144 + (lVar118 - lVar177))[lVar66] -
                                    dVar199) * dVar201 +
                                    (pdVar63[lVar112 + lVar144 + (lVar118 - lVar177)] - dVar211) *
                                    dVar197 + dVar202) - dVar202;
                          if (dVar215 <= 1e-13) {
                            dVar203 = dVar213;
                            if ((dVar215 < -1e-13) &&
                               (dVar203 = ((double)CONCAT44(uVar220,uVar218) - dVar202) / dVar215,
                               1.0 <= dVar203)) {
                              dVar203 = dVar213;
                            }
                          }
                          else {
                            dVar203 = (dVar203 - dVar202) / dVar215;
                            if (1.0 <= dVar203) {
                              dVar203 = dVar213;
                            }
                          }
                          if (dVar209 <= dVar203) {
                            dVar203 = dVar209;
                          }
                        }
                        dVar209 = dVar203;
                        if ((uVar28 >> 9 & 1) != 0) {
                          cVar140 = '\x05';
                          lVar119 = -1;
                          dVar215 = dVar202;
                          do {
                            lVar130 = -1;
                            cVar158 = cVar140;
                            do {
                              lVar120 = 0;
                              do {
                                if (((int)lVar120 != 1 || ((int)lVar130 != 0 || (int)lVar119 != 0))
                                   && ((1 << (cVar158 + (char)lVar120 & 0x1fU) & uVar28) != 0)) {
                                  dVar209 = pdVar33[lVar127 + (iVar84 + (int)lVar119) * lVar35 +
                                                              (iVar85 + (int)lVar130) * lVar34 +
                                                              (long)(iVar184 + (int)lVar120)];
                                  dVar217 = dVar209;
                                  if (dVar209 <= (double)CONCAT44(uVar221,uVar219)) {
                                    dVar217 = (double)CONCAT44(uVar221,uVar219);
                                  }
                                  if (dVar209 < dVar215) {
                                    dVar215 = dVar209;
                                  }
                                  uVar219 = SUB84(dVar217,0);
                                  uVar221 = (undefined4)((ulong)dVar217 >> 0x20);
                                }
                                lVar120 = lVar120 + 1;
                              } while (lVar120 != 3);
                              lVar130 = lVar130 + 1;
                              cVar158 = cVar158 + '\x03';
                            } while (lVar130 != 2);
                            cVar140 = cVar140 + '\t';
                            bVar186 = lVar119 != 0;
                            lVar119 = lVar119 + 1;
                          } while (bVar186);
                          dVar211 = ((((pdVar63 + lVar112 + lVar145 + (lVar118 - lVar177))[lVar66] -
                                      dVar199) * dVar201 +
                                     (pdVar63[lVar112 + lVar145 + (lVar118 - lVar177)] - dVar211) *
                                     dVar197 + dVar202) - (dVar195 + 0.5) * dVar210) - dVar202;
                          if (dVar211 <= 1e-13) {
                            dVar209 = dVar213;
                            if ((dVar211 < -1e-13) &&
                               (dVar209 = (dVar215 - dVar202) / dVar211, 1.0 <= dVar209)) {
                              dVar209 = 1.0;
                            }
                          }
                          else {
                            dVar209 = ((double)CONCAT44(uVar221,uVar219) - dVar202) / dVar211;
                            if (1.0 <= dVar209) {
                              dVar209 = dVar213;
                            }
                          }
                          if (dVar203 <= dVar209) {
                            dVar209 = dVar203;
                          }
                        }
                        dVar211 = 0.0;
                        if (1 < iVar148) {
                          dVar211 = dVar209;
                        }
                        dVar195 = 0.0;
                        if (1 < iVar132) {
                          dVar195 = dVar209;
                        }
                        dVar203 = 0.0;
                        if (1 < iVar123) {
                          dVar203 = dVar209;
                        }
                        if ((dVar200 != 1.0) || (NAN(dVar200))) {
                          dVar209 = pdVar50[lVar105 + lVar180 + lVar129];
                        }
                        else {
                          if ((((pdVar50[lVar104 + lVar180 + (int)(~uVar13 + iVar88)] == 1.0) &&
                               (!NAN(pdVar50[lVar104 + lVar180 + (int)(~uVar13 + iVar88)]))) &&
                              (pdVar50[lVar104 + lVar180 + (int)((iVar88 - uVar13) + 1)] == 1.0)) &&
                             (!NAN(pdVar50[lVar104 + lVar180 + (int)((iVar88 - uVar13) + 1)]))) {
                            dVar211 = dVar213;
                          }
                          dVar209 = pdVar50[lVar105 + lVar180 + lVar129];
                          if (((dVar209 == 1.0) && (!NAN(dVar209))) &&
                             ((pdVar50[lVar180 + lVar113 + lVar129] == 1.0 &&
                              (!NAN(pdVar50[lVar180 + lVar113 + lVar129]))))) {
                            dVar195 = 1.0;
                          }
                          if (((pdVar50[lVar104 + lVar129 + lVar101] == 1.0) &&
                              (!NAN(pdVar50[lVar104 + lVar129 + lVar101]))) &&
                             ((pdVar50[lVar104 + lVar129 + lVar102] == 1.0 &&
                              (!NAN(pdVar50[lVar104 + lVar129 + lVar102]))))) {
                            dVar203 = dVar213;
                          }
                        }
                        dVar194 = dVar208 * dVar210 * dVar203 +
                                  dVar194 * dVar197 * dVar211 +
                                  (-0.5 - dVar199) * dVar201 * dVar195 + dVar202;
                        if (dVar194 <= dVar216) {
                          dVar216 = dVar194;
                        }
                        if (dVar189 <= dVar216) {
                          dVar189 = dVar216;
                        }
                        dVar189 = pdVar32[lVar31 + lVar93 + lVar149 + (lVar118 - lVar154)] *
                                  dVar188 * -0.5 * dVar201 * dVar195 + dVar189;
                        local_928 = pdVar50 + lVar105 + lVar129;
                        if ((dVar209 == 1.0) && (!NAN(dVar209))) goto LAB_00409b9a;
                        bVar186 = false;
LAB_00409f44:
                        lVar119 = lVar118 - lVar176;
                        dVar208 = pdVar59[lVar94 + lVar108 + lVar119];
                        dVar199 = (pdVar59 + lVar94 + lVar108 + lVar119)[lVar62];
                        pdVar138 = pdVar30 + (iVar122 - iVar16) * lVar54 +
                                             iVar86 * lVar53 + (long)(iVar88 - iVar182);
                        dVar211 = pdVar138[lVar29];
                        dVar195 = *pdVar138;
                        dVar202 = pdVar138[lVar29 * 2];
                        lVar130 = (long)(iVar88 - iVar185);
                        dVar216 = pdVar33[lVar141 + lVar96 + lVar127 + lVar130];
                        dVar197 = pdVar33[lVar115 + lVar130 + lVar96 + lVar127];
                        uVar28 = pEVar47[lVar92 + (lVar2 - lVar160) * lVar48 + lVar128].flag;
                        lVar120 = -1;
                        cVar140 = '\x05';
                        lVar128 = 0;
                        do {
                          iVar132 = (int)lVar120;
                          lVar183 = -1;
                          cVar158 = cVar140;
                          do {
                            iVar123 = (int)lVar183;
                            iVar90 = (int)lVar128;
                            ppdVar134 = &local_2d8.q.p + (long)iVar90 * 3;
                            lVar128 = 0;
                            do {
                              iVar148 = (int)lVar128 + -1;
                              if (((iVar123 == 0 && iVar132 == 0) && iVar148 == 0) ||
                                 ((1 << ((char)lVar128 + cVar158 & 0x1fU) & uVar28) == 0)) {
                                *ppdVar134 = (double *)0x0;
                                ppdVar134[1] = (double *)0x0;
                                ppdVar134[2] = (double *)0x0;
                              }
                              else {
                                pdVar138 = pdVar30 + ((iVar122 - iVar16) + iVar132) * lVar54 +
                                                     (iVar86 + iVar123) * lVar53 +
                                                     (long)(iVar80 + (int)lVar128);
                                dVar194 = pdVar138[lVar29];
                                *ppdVar134 = (double *)((*pdVar138 + (double)iVar148) - dVar195);
                                ppdVar134[1] = (double *)((dVar194 + (double)iVar123) - dVar211);
                                ppdVar134[2] = (double *)
                                               ((pdVar138[lVar29 * 2] + (double)iVar132) - dVar202);
                              }
                              lVar128 = lVar128 + 1;
                              ppdVar134 = ppdVar134 + 3;
                            } while (lVar128 != 3);
                            lVar183 = lVar183 + 1;
                            cVar158 = cVar158 + '\x03';
                            lVar128 = (long)iVar90 + 3;
                          } while (lVar183 != 2);
                          lVar120 = lVar120 + 1;
                          cVar140 = cVar140 + '\t';
                          lVar128 = (long)iVar90 + 3;
                        } while (lVar120 != 2);
                        lVar120 = -1;
                        cVar140 = '\x05';
                        lVar128 = 0;
                        do {
                          lVar183 = -1;
                          cVar158 = cVar140;
                          do {
                            iVar132 = (int)lVar128;
                            lVar128 = 0;
                            do {
                              dVar194 = 0.0;
                              if (((int)lVar128 != 1 || ((int)lVar183 != 0 || (int)lVar120 != 0)) &&
                                 ((1 << (cVar158 + (char)lVar128 & 0x1fU) & uVar28) != 0)) {
                                dVar194 = pdVar33[lVar127 + (iVar84 + (int)lVar120) * lVar35 +
                                                            (iVar87 + (int)lVar183) * lVar34 +
                                                            (long)(iVar184 + (int)lVar128)] -
                                          dVar197;
                              }
                              adStack_3b8[iVar132 + lVar128] = dVar194;
                              lVar128 = lVar128 + 1;
                            } while (lVar128 != 3);
                            lVar183 = lVar183 + 1;
                            cVar158 = cVar158 + '\x03';
                            lVar128 = (long)iVar132 + 3;
                          } while (lVar183 != 2);
                          lVar120 = lVar120 + 1;
                          cVar140 = cVar140 + '\t';
                          lVar128 = (long)iVar132 + 3;
                        } while (lVar120 != 2);
                        dVar199 = dVar199 - dVar202;
                        dVar217 = 0.0;
                        dVar190 = 0.0;
                        dVar198 = 0.0;
                        pLVar121 = &local_2d8.q.kstride;
                        lVar128 = 0;
                        dVar203 = 0.0;
                        dVar210 = 0.0;
                        dVar194 = 0.0;
                        dVar201 = 0.0;
                        dVar213 = 0.0;
                        dVar215 = 0.0;
                        do {
                          pdVar138 = ((Array4<const_double> *)(pLVar121 + -2))->p;
                          dVar222 = (double)pLVar121[-1];
                          dVar204 = (double)*pLVar121;
                          dVar214 = adStack_3b8[lVar128];
                          dVar213 = dVar213 + (double)pdVar138 * dVar204;
                          dVar215 = dVar215 + dVar222 * dVar222;
                          dVar198 = dVar198 + dVar204 * dVar204;
                          dVar194 = dVar194 + (double)pdVar138 * (double)pdVar138;
                          dVar201 = dVar201 + dVar214 * (double)pdVar138;
                          dVar217 = dVar217 + dVar222 * (double)pdVar138;
                          dVar190 = dVar190 + dVar214 * dVar222;
                          dVar203 = dVar203 + dVar214 * dVar204;
                          dVar210 = dVar210 + dVar204 * dVar222;
                          lVar128 = lVar128 + 1;
                          pLVar121 = pLVar121 + 3;
                        } while (lVar128 != 0x1b);
                        dVar223 = dVar217 * dVar198 - dVar213 * dVar210;
                        dVar204 = dVar217 * dVar210 + -dVar215 * dVar213;
                        dVar214 = dVar198 * dVar190 - dVar203 * dVar210;
                        dVar222 = dVar198 * dVar215 - dVar210 * dVar210;
                        dVar198 = dVar217 * dVar203 - dVar213 * dVar190;
                        auVar191._0_8_ = dVar213 * dVar198 + (dVar194 * dVar214 - dVar223 * dVar201)
                        ;
                        auVar191._8_8_ =
                             dVar213 * (dVar190 * dVar210 - dVar203 * dVar215) +
                             (dVar201 * dVar222 - dVar214 * dVar217);
                        dVar213 = dVar204 * dVar213 + (dVar222 * dVar194 - dVar217 * dVar223);
                        auVar196._8_8_ = dVar213;
                        auVar196._0_8_ = dVar213;
                        auVar192 = divpd(auVar191,auVar196);
                        uVar187 = auVar192._0_8_;
                        dVar213 = (dVar204 * dVar201 +
                                  ((dVar215 * dVar203 + -dVar190 * dVar210) * dVar194 -
                                  dVar217 * dVar198)) / dVar213;
                        if (bVar186) {
                          uVar193 = auVar192._8_8_;
                          if ((pdVar50[lVar105 + lVar180 + ((lVar118 + -1) - lVar166)] == 1.0) &&
                             (!NAN(pdVar50[lVar105 + lVar180 + ((lVar118 + -1) - lVar166)]))) {
                            if ((pdVar50[lVar105 + lVar180 + ((lVar118 + 1) - lVar166)] == 1.0) &&
                               (!NAN(pdVar50[lVar105 + lVar180 + ((lVar118 + 1) - lVar166)]))) {
                              dVar203 = dVar197 - pdVar33[lVar115 + lVar96 + lVar127 + ((lVar118 +
                                                                                        -1) - 
                                                  lVar126)];
                              dVar210 = pdVar33[lVar115 + lVar96 + lVar127 + ((lVar118 + 1) -
                                                                             lVar126)] - dVar197;
                              dVar203 = dVar203 + dVar203;
                              dVar210 = dVar210 + dVar210;
                              dVar194 = (pdVar33[lVar115 + lVar96 + lVar127 + ((lVar118 + 1) -
                                                                              lVar126)] -
                                        pdVar33[lVar115 + lVar96 + lVar127 + ((lVar118 + -1) -
                                                                             lVar126)]) * 0.5;
                              dVar215 = ABS(dVar203);
                              uVar193 = -(ulong)(0.0 < dVar194);
                              dVar194 = ABS(dVar194);
                              dVar201 = ABS(dVar210);
                              if (dVar215 <= dVar194) {
                                dVar194 = dVar215;
                              }
                              if (dVar194 <= dVar201) {
                                dVar201 = dVar194;
                              }
                              uVar205 = -(ulong)(0.0 < dVar203 * dVar210) & (ulong)dVar201;
                              uVar193 = ~uVar193 & (uVar205 ^ 0x8000000000000000) |
                                        uVar193 & uVar205;
                            }
                          }
                          if ((((dVar200 == 1.0) && (!NAN(dVar200))) &&
                              (pdVar50[lVar180 + lVar106 + lVar129] == 1.0)) &&
                             (!NAN(pdVar50[lVar180 + lVar106 + lVar129]))) {
                            dVar210 = dVar197 - pdVar33[lVar167 + lVar96 + lVar127 + lVar130];
                            dVar203 = (dVar216 - dVar197) + (dVar216 - dVar197);
                            dVar210 = dVar210 + dVar210;
                            dVar194 = (dVar216 - pdVar33[lVar167 + lVar96 + lVar127 + lVar130]) *
                                      0.5;
                            dVar215 = ABS(dVar210);
                            uVar187 = -(ulong)(0.0 < dVar194);
                            dVar194 = ABS(dVar194);
                            dVar201 = ABS(dVar203);
                            if (dVar215 <= dVar194) {
                              dVar194 = dVar215;
                            }
                            if (dVar194 <= dVar201) {
                              dVar201 = dVar194;
                            }
                            uVar205 = -(ulong)(0.0 < dVar210 * dVar203) & (ulong)dVar201;
                            uVar187 = ~uVar187 & (uVar205 ^ 0x8000000000000000) | uVar187 & uVar205;
                          }
                          auVar192._8_8_ = uVar193;
                          auVar192._0_8_ = uVar187;
                          if (((local_928[lVar97] == 1.0) && (!NAN(local_928[lVar97]))) &&
                             ((local_928[lVar98] == 1.0 && (!NAN(local_928[lVar98]))))) {
                            dVar210 = dVar197 - pdVar33[lVar115 + lVar130 + lVar171 + lVar127];
                            dVar213 = pdVar33[lVar115 + lVar130 + lVar99 + lVar127] - dVar197;
                            dVar210 = dVar210 + dVar210;
                            dVar213 = dVar213 + dVar213;
                            dVar201 = (pdVar33[lVar115 + lVar130 + lVar99 + lVar127] -
                                      pdVar33[lVar115 + lVar130 + lVar171 + lVar127]) * 0.5;
                            dVar203 = ABS(dVar210);
                            uVar187 = -(ulong)(0.0 < dVar201);
                            dVar201 = ABS(dVar201);
                            dVar194 = ABS(dVar213);
                            if (dVar203 <= dVar201) {
                              dVar201 = dVar203;
                            }
                            if (dVar201 <= dVar194) {
                              dVar194 = dVar201;
                            }
                            uVar193 = -(ulong)(0.0 < dVar210 * dVar213) & (ulong)dVar194;
                            dVar213 = (double)(~uVar187 & (uVar193 ^ 0x8000000000000000) |
                                              uVar187 & uVar193);
                          }
                        }
                        dVar194 = dVar197;
                        if (dVar216 <= dVar197) {
                          dVar194 = dVar216;
                        }
                        dVar201 = dVar197;
                        if (dVar197 <= dVar216) {
                          dVar201 = dVar216;
                        }
                        dVar208 = dVar208 - dVar195;
                        iVar123 = 0;
                        iVar132 = 0;
                        iVar148 = 0;
                        iVar90 = 0;
                        uVar159 = 0xffffffff;
                        do {
                          uVar124 = uVar159 + 1;
                          uVar89 = 0xffffffff;
                          iVar174 = iVar123;
                          do {
                            uVar1 = uVar89 + 1;
                            iVar169 = 5;
                            do {
                              if (((uVar28 >> (iVar169 + iVar174 & 0x1fU) & 1) != 0) &&
                                 ((iVar169 != 6 || uVar89 != 0) || uVar159 != 0)) {
                                iVar132 = iVar132 + (uint)((iVar169 - 5U & 0xfffffffd) == 0 &&
                                                          (uVar89 == 0 && uVar159 == 0));
                                iVar148 = iVar148 + (uint)((iVar169 == 6 && uVar159 == 0) &&
                                                          (uVar1 & 0xfffffffd) == 0);
                                iVar90 = iVar90 + (uint)((iVar169 == 6 && uVar89 == 0) &&
                                                        (uVar124 & 0xfffffffd) == 0);
                              }
                              iVar169 = iVar169 + 1;
                            } while (iVar169 != 8);
                            iVar174 = iVar174 + 3;
                            uVar89 = uVar1;
                          } while (uVar1 != 2);
                          iVar123 = iVar123 + 9;
                          uVar159 = uVar124;
                        } while (uVar124 != 2);
                        dVar210 = auVar192._8_8_;
                        dVar216 = 2.0;
                        dVar203 = auVar192._0_8_;
                        if ((uVar28 >> 0x15 & 1) != 0) {
                          lVar128 = -1;
                          cVar140 = '\b';
                          uVar219 = SUB84(dVar197,0);
                          uVar221 = (undefined4)((ulong)dVar197 >> 0x20);
                          dVar215 = dVar197;
                          do {
                            iVar123 = 0;
                            bVar186 = true;
                            do {
                              bVar172 = bVar186;
                              lVar130 = 0;
                              do {
                                if (((int)lVar130 != 1 || (iVar123 != 0 || (int)lVar128 != 0)) &&
                                   ((1 << ((char)iVar123 * '\x03' + cVar140 + (char)lVar130 & 0x1fU)
                                    & uVar28) != 0)) {
                                  dVar216 = pdVar33[lVar127 + (iVar84 + (int)lVar128) * lVar35 +
                                                              (iVar87 + iVar123) * lVar34 +
                                                              (long)(iVar184 + (int)lVar130)];
                                  dVar217 = dVar216;
                                  if (dVar216 <= (double)CONCAT44(uVar221,uVar219)) {
                                    dVar217 = (double)CONCAT44(uVar221,uVar219);
                                  }
                                  uVar219 = SUB84(dVar217,0);
                                  uVar221 = (undefined4)((ulong)dVar217 >> 0x20);
                                  if (dVar216 < dVar215) {
                                    dVar215 = dVar216;
                                  }
                                }
                                lVar130 = lVar130 + 1;
                              } while (lVar130 != 3);
                              iVar123 = 1;
                              bVar186 = false;
                            } while (bVar172);
                            lVar128 = lVar128 + 1;
                            cVar140 = cVar140 + '\t';
                          } while (lVar128 != 2);
                          dVar217 = (dVar199 * dVar213 +
                                    (0.5 - dVar211) * dVar203 + dVar208 * dVar210 + dVar197) -
                                    dVar197;
                          if (dVar217 <= 1e-13) {
                            dVar216 = 1.0;
                            if ((dVar217 < -1e-13) &&
                               (dVar216 = (dVar215 - dVar197) / dVar217, 1.0 <= dVar216)) {
                              dVar216 = 1.0;
                            }
                          }
                          else {
                            dVar216 = ((double)CONCAT44(uVar221,uVar219) - dVar197) / dVar217;
                            if (1.0 <= dVar216) {
                              dVar216 = 1.0;
                            }
                          }
                          if (2.0 <= dVar216) {
                            dVar216 = 2.0;
                          }
                        }
                        dVar215 = dVar216;
                        if ((short)uVar28 < 0) {
                          lVar128 = -1;
                          cVar140 = '\x05';
                          dVar215 = dVar197;
                          dVar217 = dVar197;
                          do {
                            lVar130 = -1;
                            cVar158 = cVar140;
                            do {
                              lVar120 = 0;
                              do {
                                if (((int)lVar120 != 1 || ((int)lVar130 != 0 || (int)lVar128 != 0))
                                   && ((1 << (cVar158 + (char)lVar120 & 0x1fU) & uVar28) != 0)) {
                                  dVar190 = pdVar33[lVar127 + (iVar84 + (int)lVar128) * lVar35 +
                                                              (iVar87 + (int)lVar130) * lVar34 +
                                                              (long)(iVar184 + (int)lVar120)];
                                  dVar198 = dVar190;
                                  if (dVar190 <= dVar215) {
                                    dVar198 = dVar215;
                                  }
                                  dVar215 = dVar198;
                                  if (dVar190 < dVar217) {
                                    dVar217 = dVar190;
                                  }
                                }
                                lVar120 = lVar120 + 1;
                              } while (lVar120 != 3);
                              cVar158 = cVar158 + '\x03';
                              bVar186 = lVar130 != 0;
                              lVar130 = lVar130 + 1;
                            } while (bVar186);
                            lVar128 = lVar128 + 1;
                            cVar140 = cVar140 + '\t';
                          } while (lVar128 != 2);
                          dVar190 = (((pdVar59 + lVar94 + (lVar2 - iVar19) * lVar60 + lVar119)
                                      [lVar62] - dVar202) * dVar213 +
                                    (((pdVar59[lVar94 + (lVar2 - iVar19) * lVar60 + lVar119] -
                                      dVar195) * dVar210 + dVar197) - (dVar211 + 0.5) * dVar203)) -
                                    dVar197;
                          if (dVar190 <= 1e-13) {
                            dVar215 = 1.0;
                            if ((dVar190 < -1e-13) &&
                               (dVar215 = (dVar217 - dVar197) / dVar190, 1.0 <= dVar215)) {
                              dVar215 = 1.0;
                            }
                          }
                          else {
                            dVar215 = (dVar215 - dVar197) / dVar190;
                            if (1.0 <= dVar215) {
                              dVar215 = 1.0;
                            }
                          }
                          if (dVar216 <= dVar215) {
                            dVar215 = dVar216;
                          }
                        }
                        dVar216 = dVar215;
                        if ((uVar28 >> 0x13 & 1) != 0) {
                          lVar128 = -1;
                          dVar217 = dVar197;
                          dVar216 = dVar197;
                          do {
                            lVar119 = -1;
                            do {
                              iVar123 = 0;
                              bVar186 = true;
                              do {
                                bVar172 = bVar186;
                                if ((((int)lVar119 != 0 || (int)lVar128 != 0) || iVar123 != 0) &&
                                   ((1 << ((char)iVar123 +
                                           (char)lVar119 * '\x03' + (char)lVar128 * '\t' + '\x12' &
                                          0x1fU) & uVar28) != 0)) {
                                  dVar190 = pdVar33[lVar127 + (iVar84 + (int)lVar128) * lVar35 +
                                                              (iVar87 + (int)lVar119) * lVar34 +
                                                              (long)(iVar123 + (iVar88 - iVar185))];
                                  dVar198 = dVar190;
                                  if (dVar190 <= dVar216) {
                                    dVar198 = dVar216;
                                  }
                                  dVar216 = dVar198;
                                  if (dVar190 < dVar217) {
                                    dVar217 = dVar190;
                                  }
                                }
                                iVar123 = 1;
                                bVar186 = false;
                              } while (bVar172);
                              lVar119 = lVar119 + 1;
                            } while (lVar119 != 2);
                            lVar128 = lVar128 + 1;
                          } while (lVar128 != 2);
                          dVar190 = (((pdVar55 + lVar100 + lVar116 + ((iVar88 - iVar17) + 1))
                                      [lVar58] - dVar202) * dVar213 +
                                    (pdVar55[lVar100 + lVar116 + ((iVar88 - iVar17) + 1)] - dVar211)
                                    * dVar203 + (0.5 - dVar195) * dVar210 + dVar197) - dVar197;
                          if (dVar190 <= 1e-13) {
                            dVar216 = 1.0;
                            if (dVar190 < -1e-13) {
                              dVar216 = (dVar217 - dVar197) / dVar190;
                              if (1.0 <= dVar216) {
                                dVar216 = 1.0;
                              }
                            }
                          }
                          else {
                            dVar216 = (dVar216 - dVar197) / dVar190;
                            if (1.0 <= dVar216) {
                              dVar216 = 1.0;
                            }
                          }
                          if (dVar215 <= dVar216) {
                            dVar216 = dVar215;
                          }
                        }
                        dVar215 = dVar216;
                        if ((uVar28 >> 0x11 & 1) != 0) {
                          lVar128 = -1;
                          cVar140 = '\x05';
                          dVar217 = dVar197;
                          dVar215 = dVar197;
                          do {
                            lVar119 = -1;
                            cVar158 = cVar140;
                            do {
                              lVar130 = 0;
                              do {
                                if (((int)lVar130 != 1 || ((int)lVar119 != 0 || (int)lVar128 != 0))
                                   && ((1 << (cVar158 + (char)lVar130 & 0x1fU) & uVar28) != 0)) {
                                  dVar190 = pdVar33[lVar127 + (iVar84 + (int)lVar128) * lVar35 +
                                                              (iVar87 + (int)lVar119) * lVar34 +
                                                              (long)(iVar184 + (int)lVar130)];
                                  dVar198 = dVar190;
                                  if (dVar190 <= dVar215) {
                                    dVar198 = dVar215;
                                  }
                                  dVar215 = dVar198;
                                  if (dVar190 < dVar217) {
                                    dVar217 = dVar190;
                                  }
                                }
                                lVar130 = lVar130 + 1;
                              } while (lVar130 != 2);
                              lVar119 = lVar119 + 1;
                              cVar158 = cVar158 + '\x03';
                            } while (lVar119 != 2);
                            lVar128 = lVar128 + 1;
                            cVar140 = cVar140 + '\t';
                          } while (lVar128 != 2);
                          dVar190 = (((pdVar55 + lVar100 + lVar116 + (lVar118 - iVar17))[lVar58] -
                                     dVar202) * dVar213 +
                                    (pdVar55[lVar100 + lVar116 + (lVar118 - iVar17)] - dVar211) *
                                    dVar203 + (dVar197 - (dVar195 + 0.5) * dVar210)) - dVar197;
                          if (dVar190 <= 1e-13) {
                            dVar215 = 1.0;
                            if (dVar190 < -1e-13) {
                              dVar215 = (dVar217 - dVar197) / dVar190;
                              if (1.0 <= dVar215) {
                                dVar215 = 1.0;
                              }
                            }
                          }
                          else {
                            dVar215 = (dVar215 - dVar197) / dVar190;
                            if (1.0 <= dVar215) {
                              dVar215 = 1.0;
                            }
                          }
                          if (dVar216 <= dVar215) {
                            dVar215 = dVar216;
                          }
                        }
                        dVar216 = dVar215;
                        if ((uVar28 >> 0x1b & 1) != 0) {
                          iVar123 = 0;
                          dVar216 = dVar197;
                          dVar217 = dVar197;
                          bVar186 = true;
                          do {
                            bVar172 = bVar186;
                            iVar174 = iVar123 * 9 + 0xe;
                            lVar128 = -1;
                            do {
                              lVar119 = 0;
                              do {
                                if (((int)lVar119 != 1 || ((int)lVar128 != 0 || iVar123 != 0)) &&
                                   ((1 << ((char)iVar174 + (char)lVar119 & 0x1fU) & uVar28) != 0)) {
                                  dVar190 = pdVar33[lVar127 + (iVar84 + iVar123) * lVar35 +
                                                              (iVar87 + (int)lVar128) * lVar34 +
                                                              (long)(iVar184 + (int)lVar119)];
                                  dVar198 = dVar190;
                                  if (dVar190 <= dVar216) {
                                    dVar198 = dVar216;
                                  }
                                  dVar216 = dVar198;
                                  if (dVar190 < dVar217) {
                                    dVar217 = dVar190;
                                  }
                                }
                                lVar119 = lVar119 + 1;
                              } while (lVar119 != 3);
                              lVar128 = lVar128 + 1;
                              iVar174 = iVar174 + 3;
                            } while (lVar128 != 2);
                            iVar123 = 1;
                            bVar186 = false;
                          } while (bVar172);
                          dVar190 = ((0.5 - dVar202) * dVar213 +
                                    ((pdVar63 + lVar117 + lVar144 + (lVar118 - lVar177))[lVar66] -
                                    dVar211) * dVar203 +
                                    (pdVar63[lVar117 + lVar144 + (lVar118 - lVar177)] - dVar195) *
                                    dVar210 + dVar197) - dVar197;
                          if (dVar190 <= 1e-13) {
                            dVar216 = 1.0;
                            if ((dVar190 < -1e-13) &&
                               (dVar216 = (dVar217 - dVar197) / dVar190, 1.0 <= dVar216)) {
                              dVar216 = 1.0;
                            }
                          }
                          else {
                            dVar216 = (dVar216 - dVar197) / dVar190;
                            if (1.0 <= dVar216) {
                              dVar216 = 1.0;
                            }
                          }
                          if (dVar215 <= dVar216) {
                            dVar216 = dVar215;
                          }
                        }
                        dVar215 = dVar216;
                        if ((uVar28 >> 9 & 1) != 0) {
                          cVar140 = '\x05';
                          lVar128 = -1;
                          dVar217 = dVar197;
                          dVar215 = dVar197;
                          do {
                            lVar119 = -1;
                            cVar158 = cVar140;
                            do {
                              lVar130 = 0;
                              do {
                                if (((int)lVar130 != 1 || ((int)lVar119 != 0 || (int)lVar128 != 0))
                                   && ((1 << (cVar158 + (char)lVar130 & 0x1fU) & uVar28) != 0)) {
                                  dVar190 = pdVar33[lVar127 + (iVar84 + (int)lVar128) * lVar35 +
                                                              (iVar87 + (int)lVar119) * lVar34 +
                                                              (long)(iVar184 + (int)lVar130)];
                                  dVar198 = dVar190;
                                  if (dVar190 <= dVar215) {
                                    dVar198 = dVar215;
                                  }
                                  dVar215 = dVar198;
                                  if (dVar190 < dVar217) {
                                    dVar217 = dVar190;
                                  }
                                }
                                lVar130 = lVar130 + 1;
                              } while (lVar130 != 3);
                              lVar119 = lVar119 + 1;
                              cVar158 = cVar158 + '\x03';
                            } while (lVar119 != 2);
                            cVar140 = cVar140 + '\t';
                            bVar186 = lVar128 != 0;
                            lVar128 = lVar128 + 1;
                          } while (bVar186);
                          dVar195 = ((((pdVar63 + lVar117 + lVar145 + (lVar118 - lVar177))[lVar66] -
                                      dVar211) * dVar203 +
                                     (pdVar63[lVar117 + lVar145 + (lVar118 - lVar177)] - dVar195) *
                                     dVar210 + dVar197) - (dVar202 + 0.5) * dVar213) - dVar197;
                          if (dVar195 <= 1e-13) {
                            dVar215 = 1.0;
                            if (dVar195 < -1e-13) {
                              dVar215 = (dVar217 - dVar197) / dVar195;
                              if (1.0 <= dVar215) {
                                dVar215 = 1.0;
                              }
                            }
                          }
                          else {
                            dVar215 = (dVar215 - dVar197) / dVar195;
                            if (1.0 <= dVar215) {
                              dVar215 = 1.0;
                            }
                          }
                          if (dVar216 <= dVar215) {
                            dVar215 = dVar216;
                          }
                        }
                        dVar195 = 0.0;
                        if (1 < iVar132) {
                          dVar195 = dVar215;
                        }
                        dVar202 = 0.0;
                        if (1 < iVar148) {
                          dVar202 = dVar215;
                        }
                        dVar216 = 0.0;
                        if (1 < iVar90) {
                          dVar216 = dVar215;
                        }
                        if ((dVar209 == 1.0) && (!NAN(dVar209))) {
                          if ((pdVar50[lVar105 + lVar180 + (int)(~uVar13 + iVar88)] == 1.0) &&
                             ((pdVar50[lVar105 + lVar180 + (int)((iVar88 - uVar13) + 1)] == 1.0 &&
                              (!NAN(pdVar50[lVar105 + lVar180 + (int)((iVar88 - uVar13) + 1)]))))) {
                            dVar195 = 1.0;
                          }
                          dVar202 = (double)(~-(ulong)(dVar200 == 1.0) & (ulong)dVar202 |
                                            (~-(ulong)(pdVar50[lVar180 + lVar114 + lVar129] == 1.0)
                                             & (ulong)dVar202 |
                                            -(ulong)(pdVar50[lVar180 + lVar114 + lVar129] == 1.0) &
                                            0x3ff0000000000000) & -(ulong)(dVar200 == 1.0));
                          if (((pdVar50[lVar105 + lVar129 + lVar101] == 1.0) &&
                              (pdVar50[lVar105 + lVar129 + lVar102] == 1.0)) &&
                             (!NAN(pdVar50[lVar105 + lVar129 + lVar102]))) {
                            dVar216 = 1.0;
                          }
                        }
                        dVar200 = dVar199 * dVar213 * dVar216 +
                                  (0.5 - dVar211) * dVar203 * dVar202 +
                                  dVar208 * dVar210 * dVar195 + dVar197;
                        if (dVar200 <= dVar201) {
                          dVar201 = dVar200;
                        }
                        if (dVar194 <= dVar201) {
                          dVar194 = dVar201;
                        }
                        dVar194 = pdVar32[lVar31 + lVar93 + lVar163 + (lVar118 - lVar154)] *
                                  dVar188 * -0.5 * dVar203 * dVar202 + dVar194;
                      }
                      else {
                        local_928 = pdVar50 + lVar105 + lVar129;
                        if ((local_928[lVar180] != 1.0) || (NAN(local_928[lVar180])))
                        goto LAB_00408531;
                        dVar189 = pdVar50[lVar180 + lVar107 + lVar129];
                        if ((((pdVar50[lVar180 + lVar106 + lVar129] != 1.0) ||
                             (NAN(pdVar50[lVar180 + lVar106 + lVar129]))) || (dVar189 != 1.0)) ||
                           (NAN(dVar189))) {
                          if ((dVar189 != 1.0) || (NAN(dVar189))) goto LAB_00408531;
LAB_0040b47f:
                          lVar119 = lVar118 - lVar126;
                          dVar189 = pdVar33[lVar141 + lVar156 + lVar127 + lVar119];
                          dVar211 = dVar189 - pdVar33[lVar150 + lVar156 + lVar127 + lVar119];
                          dVar195 = pdVar33[lVar151 + lVar156 + lVar127 + lVar119] - dVar189;
                          dVar211 = dVar211 + dVar211;
                          dVar195 = dVar195 + dVar195;
                          dVar194 = (pdVar33[lVar151 + lVar156 + lVar127 + lVar119] -
                                    pdVar33[lVar150 + lVar156 + lVar127 + lVar119]) * 0.5;
                          dVar199 = ABS(dVar211);
                          uVar187 = -(ulong)(0.0 < dVar194);
                          dVar194 = ABS(dVar194);
                          dVar208 = ABS(dVar195);
                          if (dVar199 <= dVar194) {
                            dVar194 = dVar199;
                          }
                          if (dVar194 <= dVar208) {
                            dVar208 = dVar194;
                          }
                          uVar193 = -(ulong)(0.0 < dVar211 * dVar195) & (ulong)dVar208;
                          dVar189 = (double)(~uVar187 & (uVar193 ^ 0x8000000000000000) |
                                            uVar187 & uVar193) *
                                    (-1.0 - pdVar32[lVar31 + lVar93 + lVar149 + (lVar118 - lVar154)]
                                            * dVar188) * 0.5 + dVar189;
                        }
                        else {
                          if ((pdVar50[lVar180 + ((lVar181 + 2) - lVar161) * lVar51 + lVar129] !=
                               1.0) || (NAN(pdVar50[lVar180 + ((lVar181 + 2) - lVar161) * lVar51 +
                                                              lVar129]))) goto LAB_0040b47f;
                          lVar119 = lVar118 - lVar126;
                          dVar189 = pdVar33[lVar141 + lVar156 + lVar127 + lVar119];
                          dVar199 = dVar189 - pdVar33[lVar150 + lVar156 + lVar127 + lVar119];
                          dVar211 = pdVar33[lVar150 + lVar156 + lVar127 + lVar119] -
                                    pdVar33[lVar167 + lVar156 + lVar127 + lVar119];
                          dVar208 = 0.0;
                          dVar194 = 0.0;
                          if (0.0 <= dVar199 * dVar211) {
                            dVar194 = ABS(dVar199);
                            if (ABS(dVar211) <= ABS(dVar199)) {
                              dVar194 = ABS(dVar211);
                            }
                            dVar194 = dVar194 + dVar194;
                          }
                          dVar202 = pdVar33[lVar127 + lVar156 + ((lVar181 + 2) - lVar152) * lVar34 +
                                                                lVar119] -
                                    pdVar33[lVar151 + lVar156 + lVar127 + lVar119];
                          dVar216 = pdVar33[lVar151 + lVar156 + lVar127 + lVar119] - dVar189;
                          dVar195 = (dVar216 + dVar202) * 0.5;
                          if (0.0 <= dVar216 * dVar202) {
                            dVar208 = ABS(dVar202);
                            if (ABS(dVar216) <= ABS(dVar202)) {
                              dVar208 = ABS(dVar216);
                            }
                            dVar208 = dVar208 + dVar208;
                          }
                          dVar197 = (dVar199 + dVar216) * 0.5;
                          dVar202 = 0.0;
                          if (0.0 <= dVar199 * dVar216) {
                            dVar202 = ABS(dVar216);
                            if (ABS(dVar199) <= ABS(dVar216)) {
                              dVar202 = ABS(dVar199);
                            }
                            dVar202 = dVar202 + dVar202;
                          }
                          dVar211 = (dVar199 + dVar211) * 0.5;
                          dVar199 = ABS(dVar211);
                          if (dVar194 <= dVar199) {
                            dVar199 = dVar194;
                          }
                          uVar187 = (ulong)DAT_00753000;
                          dVar194 = ABS(dVar195);
                          if (dVar208 <= dVar194) {
                            dVar194 = dVar208;
                          }
                          dVar194 = ABS(dVar197 * 1.3333333333333333 +
                                        (dVar194 * (double)((ulong)dVar195 & 0x8000000000000000 |
                                                           uVar187) +
                                        dVar199 * (double)((ulong)dVar211 & 0x8000000000000000 |
                                                          uVar187)) * -0.16666666666666666);
                          if (dVar202 <= dVar194) {
                            dVar194 = dVar202;
                          }
                          dVar189 = dVar194 * (double)((ulong)dVar197 & 0x8000000000000000 | uVar187
                                                      ) *
                                    (-1.0 - pdVar32[lVar31 + lVar93 + lVar149 + (lVar118 - lVar154)]
                                            * dVar188) * 0.5 + dVar189;
                        }
LAB_00409b9a:
                        dVar194 = pdVar50[lVar180 + lVar114 + lVar129];
                        if ((((dVar194 != 1.0) || (NAN(dVar194))) ||
                            (pdVar50[lVar180 + ((iVar173 + -3) - iVar135) * lVar51 + lVar129] != 1.0
                            )) || (NAN(pdVar50[lVar180 + ((iVar173 + -3) - iVar135) * lVar51 +
                                                         lVar129]))) {
                          if (((dVar200 != 1.0) || (NAN(dVar200))) ||
                             ((dVar194 != 1.0 || (NAN(dVar194))))) goto LAB_00409f1f;
LAB_00409e38:
                          lVar128 = lVar118 - lVar126;
                          dVar200 = pdVar33[lVar150 + lVar156 + lVar127 + lVar128];
                          dVar199 = dVar200 - pdVar33[lVar127 + lVar156 + lVar146 + lVar128];
                          dVar211 = pdVar33[lVar141 + lVar156 + lVar127 + lVar128] - dVar200;
                          dVar199 = dVar199 + dVar199;
                          dVar211 = dVar211 + dVar211;
                          dVar194 = (pdVar33[lVar141 + lVar156 + lVar127 + lVar128] -
                                    pdVar33[lVar127 + lVar156 + lVar146 + lVar128]) * 0.5;
                          dVar195 = ABS(dVar199);
                          uVar187 = -(ulong)(0.0 < dVar194);
                          dVar194 = ABS(dVar194);
                          dVar208 = ABS(dVar211);
                          if (dVar195 <= dVar194) {
                            dVar194 = dVar195;
                          }
                          if (dVar194 <= dVar208) {
                            dVar208 = dVar194;
                          }
                          uVar193 = -(ulong)(0.0 < dVar199 * dVar211) & (ulong)dVar208;
                          dVar194 = (double)(~uVar187 & (uVar193 ^ 0x8000000000000000) |
                                            uVar187 & uVar193) *
                                    (1.0 - pdVar32[lVar31 + lVar93 + lVar163 + (lVar118 - lVar154)]
                                           * dVar188) * 0.5;
                        }
                        else {
                          if ((dVar200 != 1.0) || (NAN(dVar200))) {
LAB_00409f1f:
                            bVar186 = true;
                            dVar209 = 1.0;
                            goto LAB_00409f44;
                          }
                          if ((pdVar50[lVar180 + lVar113 + lVar129] != 1.0) ||
                             (NAN(pdVar50[lVar180 + lVar113 + lVar129]))) goto LAB_00409e38;
                          lVar128 = lVar118 - lVar126;
                          dVar200 = pdVar33[lVar150 + lVar156 + lVar127 + lVar128];
                          dVar199 = dVar200 - pdVar33[lVar127 + lVar156 + lVar146 + lVar128];
                          dVar211 = pdVar33[lVar127 + lVar156 + lVar146 + lVar128] -
                                    pdVar33[lVar127 + lVar156 + ((iVar173 + -3) - iVar170) * lVar34
                                                                + lVar128];
                          dVar208 = 0.0;
                          dVar194 = 0.0;
                          if (0.0 <= dVar199 * dVar211) {
                            dVar194 = ABS(dVar199);
                            if (ABS(dVar211) <= ABS(dVar199)) {
                              dVar194 = ABS(dVar211);
                            }
                            dVar194 = dVar194 + dVar194;
                          }
                          dVar195 = pdVar33[lVar127 + lVar156 + (iVar136 - iVar170) * lVar34 +
                                                                lVar128] -
                                    pdVar33[lVar141 + lVar156 + lVar127 + lVar128];
                          dVar216 = pdVar33[lVar141 + lVar156 + lVar127 + lVar128] - dVar200;
                          dVar202 = (dVar216 + dVar195) * 0.5;
                          if (0.0 <= dVar216 * dVar195) {
                            dVar208 = ABS(dVar195);
                            if (ABS(dVar216) <= ABS(dVar195)) {
                              dVar208 = ABS(dVar216);
                            }
                            dVar208 = dVar208 + dVar208;
                          }
                          dVar197 = (dVar199 + dVar216) * 0.5;
                          dVar195 = 0.0;
                          if (0.0 <= dVar199 * dVar216) {
                            dVar195 = ABS(dVar216);
                            if (ABS(dVar199) <= ABS(dVar216)) {
                              dVar195 = ABS(dVar199);
                            }
                            dVar195 = dVar195 + dVar195;
                          }
                          dVar211 = (dVar199 + dVar211) * 0.5;
                          dVar199 = ABS(dVar211);
                          if (dVar194 <= dVar199) {
                            dVar199 = dVar194;
                          }
                          dVar194 = ABS(dVar202);
                          if (dVar208 <= dVar194) {
                            dVar194 = dVar208;
                          }
                          dVar194 = ABS(dVar197 * 1.3333333333333333 +
                                        (dVar194 * (double)((ulong)dVar202 & 0x8000000000000000 |
                                                           0x3ff0000000000000) +
                                        dVar199 * (double)((ulong)dVar211 & 0x8000000000000000 |
                                                          0x3ff0000000000000)) *
                                        -0.16666666666666666);
                          if (dVar195 <= dVar194) {
                            dVar194 = dVar195;
                          }
                          dVar194 = dVar194 * (double)((ulong)dVar197 & 0x8000000000000000 |
                                                      0x3ff0000000000000) *
                                    (1.0 - pdVar32[lVar31 + lVar93 + lVar163 + (lVar118 - lVar154)]
                                           * dVar188) * 0.5;
                        }
                        dVar194 = dVar194 + dVar200;
                      }
                    }
                    pdVar43[local_898 * lVar46 +
                            (lVar131 - iVar10) * lVar45 +
                            (int)(~uVar9 + iVar173) * lVar44 + (lVar118 - iVar8)] = dVar194;
                    pdVar39[local_898 * lVar42 +
                            (lVar131 - iVar7) * lVar41 +
                            (lVar181 - iVar6) * lVar40 + (lVar118 - iVar5)] = dVar189;
                    lVar118 = lVar118 + 1;
                    pdVar137 = pdVar137 + 1;
                    pdVar147 = pdVar147 + 1;
                    pdVar157 = pdVar157 + 1;
                    iVar184 = iVar184 + 1;
                    iVar80 = iVar80 + 1;
                  } while (iVar25 + 1 != (int)lVar118);
                }
                lVar181 = lVar181 + 1;
              } while ((int)uVar103 != iVar26 + 1);
            }
            lVar131 = lVar131 + 1;
          } while (iVar27 + 1 != (int)uVar91);
        }
        local_898 = local_898 + 1;
        if (local_898 == 3) {
          return;
        }
      } while( true );
    }
  }
  else {
    iVar6 = (yebox->bigend).vect[0];
  }
  local_2d8.q.p = q->p;
  local_2d8.q.jstride = q->jstride;
  local_2d8.q.kstride = q->kstride;
  local_2d8.q.nstride = q->nstride;
  local_2d8.q.begin.x = (q->begin).x;
  local_2d8.q.begin.y = (q->begin).y;
  uVar67 = *(undefined8 *)&(q->begin).z;
  uVar68 = (q->end).y;
  local_2d8.q._52_8_ = *(undefined8 *)&(q->end).z;
  local_2d8.q.begin.z = (int)uVar67;
  local_2d8.q.end.x = (int)((ulong)uVar67 >> 0x20);
  local_2d8.ccvel.p = ccvel->p;
  local_2d8.ccvel.jstride = ccvel->jstride;
  local_2d8.ccvel.kstride = ccvel->kstride;
  local_2d8.ccvel.nstride = ccvel->nstride;
  local_2d8.ccvel.begin.x = (ccvel->begin).x;
  local_2d8.ccvel.begin.y = (ccvel->begin).y;
  uVar69 = (ccvel->end).x;
  uVar70 = (ccvel->end).y;
  local_2d8.ccvel._52_8_ = *(undefined8 *)&(ccvel->end).z;
  local_2d8.ccvel.begin.z = (int)*(undefined8 *)&(ccvel->begin).z;
  local_2d8.Imy.p = Imy->p;
  local_2d8.Imy.jstride = Imy->jstride;
  local_2d8.Imy.kstride = Imy->kstride;
  local_2d8.Imy.nstride = Imy->nstride;
  local_2d8.Imy.begin.x = (Imy->begin).x;
  local_2d8.Imy.begin.y = (Imy->begin).y;
  uVar67 = *(undefined8 *)&(Imy->begin).z;
  uVar71 = (Imy->end).y;
  local_2d8.Imy._52_8_ = *(undefined8 *)&(Imy->end).z;
  local_2d8.Imy.begin.z = (int)uVar67;
  local_2d8.Imy.end.x = (int)((ulong)uVar67 >> 0x20);
  local_2d8.Ipy.p = Ipy->p;
  local_2d8.Ipy.jstride = Ipy->jstride;
  local_2d8.Ipy.kstride = Ipy->kstride;
  local_2d8.Ipy.nstride = Ipy->nstride;
  local_2d8.Ipy.begin.x = (Ipy->begin).x;
  local_2d8.Ipy.begin.y = (Ipy->begin).y;
  uVar72 = (Ipy->end).x;
  uVar73 = (Ipy->end).y;
  local_2d8.Ipy._52_8_ = *(undefined8 *)&(Ipy->end).z;
  local_2d8.Ipy.begin.z = (int)*(undefined8 *)&(Ipy->begin).z;
  local_2d8.pbc = pbc;
  local_2d8.flag.p = flag->p;
  local_2d8.flag.jstride = flag->jstride;
  local_2d8.flag.kstride = flag->kstride;
  local_2d8.flag.nstride = flag->nstride;
  local_2d8.flag.begin.x = (flag->begin).x;
  local_2d8.flag.begin.y = (flag->begin).y;
  uVar67 = *(undefined8 *)&(flag->begin).z;
  uVar74 = (flag->end).y;
  local_2d8.flag._52_8_ = *(undefined8 *)&(flag->end).z;
  local_2d8.flag.begin.z = (int)uVar67;
  local_2d8.flag.end.x = (int)((ulong)uVar67 >> 0x20);
  local_2d8.vfrac.p = vfrac->p;
  local_2d8.vfrac.jstride = vfrac->jstride;
  local_2d8.vfrac.kstride = vfrac->kstride;
  local_2d8.vfrac.nstride = vfrac->nstride;
  local_2d8.vfrac.begin.x = (vfrac->begin).x;
  local_2d8.vfrac.begin.y = (vfrac->begin).y;
  uVar67 = *(undefined8 *)&(vfrac->begin).z;
  uVar75 = (vfrac->end).y;
  local_2d8.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
  local_2d8.vfrac.begin.z = (int)uVar67;
  local_2d8.vfrac.end.x = (int)((ulong)uVar67 >> 0x20);
  local_2d8.ccc.p = ccc->p;
  local_2d8.ccc.jstride = ccc->jstride;
  local_2d8.ccc.kstride = ccc->kstride;
  local_2d8.ccc.nstride = ccc->nstride;
  local_2d8.ccc.begin.x = (ccc->begin).x;
  local_2d8.ccc.begin.y = (ccc->begin).y;
  uVar67 = *(undefined8 *)&(ccc->begin).z;
  uVar76 = (ccc->end).y;
  local_2d8.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
  local_2d8.ccc.begin.z = (int)uVar67;
  local_2d8.ccc.end.x = (int)((ulong)uVar67 >> 0x20);
  local_2d8.fcx.p = fcx->p;
  local_2d8.fcx.jstride = fcx->jstride;
  local_2d8.fcx.kstride = fcx->kstride;
  local_2d8.fcx.nstride = fcx->nstride;
  local_2d8.fcx.begin.x = (fcx->begin).x;
  local_2d8.fcx.begin.y = (fcx->begin).y;
  uVar67 = *(undefined8 *)&(fcx->begin).z;
  uVar77 = (fcx->end).y;
  local_2d8.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
  local_2d8.fcx.begin.z = (int)uVar67;
  local_2d8.fcx.end.x = (int)((ulong)uVar67 >> 0x20);
  local_2d8.fcy.p = fcy->p;
  local_2d8.fcy.jstride = fcy->jstride;
  local_2d8.fcy.kstride = fcy->kstride;
  local_2d8.fcy.nstride = fcy->nstride;
  local_2d8.fcy.begin.x = (fcy->begin).x;
  local_2d8.fcy.begin.y = (fcy->begin).y;
  uVar67 = *(undefined8 *)&(fcy->begin).z;
  uVar78 = (fcy->end).y;
  local_2d8.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
  local_2d8.fcy.begin.z = (int)uVar67;
  local_2d8.fcy.end.x = (int)((ulong)uVar67 >> 0x20);
  local_2d8.fcz.p = fcz->p;
  local_2d8.fcz.jstride = fcz->jstride;
  local_2d8.fcz.kstride = fcz->kstride;
  local_2d8.fcz.nstride = fcz->nstride;
  local_2d8.fcz.begin.x = (fcz->begin).x;
  local_2d8.fcz.begin.y = (fcz->begin).y;
  uVar67 = *(undefined8 *)&(fcz->begin).z;
  uVar79 = (fcz->end).y;
  local_2d8.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
  local_2d8.fcz.begin.z = (int)uVar67;
  local_2d8.fcz.end.x = (int)((ulong)uVar67 >> 0x20);
  iVar7 = (yebox->smallend).vect[0];
  iVar8 = (yebox->smallend).vect[1];
  iVar10 = (yebox->smallend).vect[2];
  iVar11 = (yebox->bigend).vect[1];
  iVar12 = (yebox->bigend).vect[2];
  iVar135 = 0;
  local_2d8.q.end.y = uVar68;
  local_2d8.ccvel.end.x = uVar69;
  local_2d8.ccvel.end.y = uVar70;
  local_2d8.domain_ilo = iVar182;
  local_2d8.domain_jlo = iVar185;
  local_2d8.domain_klo = iVar4;
  local_2d8.domain_ihi = iVar170;
  local_2d8.domain_jhi = iVar3;
  local_2d8.domain_khi = iVar5;
  local_2d8.Imy.end.y = uVar71;
  local_2d8.Ipy.end.x = uVar72;
  local_2d8.Ipy.end.y = uVar73;
  local_2d8.dtdy = dVar188;
  local_2d8.flag.end.y = uVar74;
  local_2d8.vfrac.end.y = uVar75;
  local_2d8.ccc.end.y = uVar76;
  local_2d8.fcx.end.y = uVar77;
  local_2d8.fcy.end.y = uVar78;
  local_2d8.fcz.end.y = uVar79;
  do {
    iVar182 = iVar10;
    if (iVar10 <= iVar12) {
      do {
        iVar185 = iVar8;
        if (iVar8 <= iVar11) {
          do {
            iVar170 = iVar7;
            if (iVar7 <= iVar6) {
              do {
                PredictVelOnYFace::anon_class_680_18_513cbdb0::operator()
                          (&local_2d8,iVar170,iVar185,iVar182,iVar135);
                iVar170 = iVar170 + 1;
              } while (iVar6 + 1 != iVar170);
            }
            bVar186 = iVar185 != iVar11;
            iVar185 = iVar185 + 1;
          } while (bVar186);
        }
        bVar186 = iVar182 != iVar12;
        iVar182 = iVar182 + 1;
      } while (bVar186);
    }
    iVar135 = iVar135 + 1;
  } while (iVar135 != 3);
  return;
}

Assistant:

void
EBPLM::PredictVelOnYFace (Box const& yebox,
                          Array4<Real> const& Imy, Array4<Real> const& Ipy,
                          Array4<Real const> const& q,
                          Array4<Real const> const& ccvel,
                          Array4<EBCellFlag const> const& flag,
                          Array4<Real const> const& vfrac,
                          AMREX_D_DECL(Array4<Real const> const& fcx,
                                       Array4<Real const> const& fcy,
                                       Array4<Real const> const& fcz),
                          Array4<Real const> const& ccc,
                          Geometry& geom,
                          Real dt,
                          Vector<BCRec> const& h_bcrec,
                          BCRec const* pbc)
{
    const Real dy = geom.CellSize(1);
    const Real dtdy = dt/dy;
    int ncomp = AMREX_SPACEDIM;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::y));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;

#if (AMREX_SPACEDIM == 3)
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;
#endif

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= yebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= yebox.bigEnd(0)    ) ||
#if (AMREX_SPACEDIM == 3)
         (has_extdir_or_ho_lo_z && domain_klo >= yebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= yebox.bigEnd(2)    ) ||
#endif
         (has_extdir_or_ho_lo_y && domain_jlo >= yebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= yebox.bigEnd(1)    ) )
    {
        amrex::ParallelFor(yebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                  AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imy,Ipy,dtdy,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apy(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
#if (AMREX_SPACEDIM == 3)
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);
#endif

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. &&
                                           vfrac(i,j+1,k) == 1. && vfrac(i,j+2,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j  ,k,n) + 0.5 * (-1.0 - ccvel(i  ,j,k,1) * dtdy) *
                        amrex_calc_yslope_extdir(i,j,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j+1,k) == 1.) {

                    int order = 2;
                    qpls = q(i,j  ,k,n) + 0.5 * (-1.0 - ccvel(i  ,j,k,1) * dtdy) *
                        amrex_calc_yslope_extdir(i,j,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We need to use LS slopes
                } else {

                    Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                    Real zf = fcy(i,j,k,1);
#endif
                    AMREX_D_TERM(Real delta_y = -0.5 - ccc(i,j,k,1);,
                                 Real delta_x =  xf  - ccc(i,j,k,0);,
                                 Real delta_z =  zf  - ccc(i,j,k,2););

                    Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                    Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                    // This will be used in the EB slope routine only if the slope can be computed without LS
                    int max_order = 2;

                    const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                               AMREX_D_DECL(fcx,fcy,fcz), flag,
                                               AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                               AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                               AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                               AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                               max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) + delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) + delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdy * ccvel(i,j,k,1) * slopes_eb_hi[1];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j-3,k) == 1. &&
                                             vfrac(i,j  ,k) == 1. && vfrac(i,j+1,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - ccvel(i,j-1,k,1) * dtdy) *
                        amrex_calc_yslope_extdir(i,j-1,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j  ,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - ccvel(i,j-1,k,1) * dtdy) *
                        amrex_calc_yslope_extdir(i,j-1,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We need to use LS slopes
                } else {

                    Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                    Real zf = fcy(i,j,k,1);
#endif
                    AMREX_D_TERM(Real delta_y = 0.5 - ccc(i,j-1,k,1);,
                                 Real delta_x = xf  - ccc(i,j-1,k,0);,
                                 Real delta_z = zf  - ccc(i,j-1,k,2););

                    Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                    Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                    // This will be used in the EB slope routine only if the slope can be computed without LS
                    int max_order = 2;

                    const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j-1,k,n,q,ccc,vfrac,
                                               AMREX_D_DECL(fcx,fcy,fcz), flag,
                                               AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                               AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                               AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                               AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                               max_order);


#if (AMREX_SPACEDIM == 3)
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdy * ccvel(i,j-1,k,1) * slopes_eb_lo[1];

                }  // end of making qmns
            }

            Ipy(i,j-1,k,n) = qmns;
            Imy(i,j  ,k,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(yebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                          AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imy,Ipy,dtdy,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apx(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. &&
                                           vfrac(i,j+1,k) == 1. && vfrac(i,j+2,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,1) * dtdy) *
                        amrex_calc_yslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j+1,k) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,1) * dtdy) *
                        amrex_calc_yslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = -0.5 - ccc(i,j,k,1);,
                                Real delta_x =  xf  - ccc(i,j,k,0);,
                                Real delta_z =  zf  - ccc(i,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) + delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) + delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdy * ccvel(i,j,k,1) * slopes_eb_hi[1];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j-3,k) == 1. &&
                                             vfrac(i,j  ,k) == 1. && vfrac(i,j+1,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - ccvel(i,j-1,k,1) * dtdy) *
                        amrex_calc_yslope(i,j-1,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j  ,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - ccvel(i,j-1,k,1) * dtdy) *
                        amrex_calc_yslope(i,j-1,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 - ccc(i,j-1,k,1);,
                                Real delta_x = xf  - ccc(i,j-1,k,0);,
                                Real delta_z = zf  - ccc(i,j-1,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j-1,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdy * ccvel(i,j-1,k,1) * slopes_eb_lo[1];

                }  // end of making qmns
            }

            Ipy(i,j-1,k,n) = qmns;
            Imy(i,j  ,k,n) = qpls;
        });
    }
}